

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderDepthbuffer::invokeGLES2
          (RenderDepthbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  Functions *gl_00;
  glBindFramebufferFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  glRenderbufferStorageFunc p_Var3;
  Library *egl;
  glViewportFunc p_Var4;
  glUniform4fFunc p_Var5;
  glReadPixelsFunc p_Var6;
  bool bVar7;
  deUint32 dVar8;
  GLenum GVar9;
  deBool dVar10;
  int iVar11;
  int iVar12;
  GLuint GVar13;
  TestLog *this_00;
  TextureFormat *pTVar14;
  IllegalRendererException *this_01;
  MessageBuilder *this_02;
  UniqueImage *this_03;
  EGLImage img_00;
  TestError *pTVar15;
  ConstPixelBufferAccess *this_04;
  void *pvVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  PixelBufferAccess local_468;
  int local_43c;
  undefined1 auStack_438 [4];
  int level_1;
  Vec4 result;
  int x;
  int y;
  undefined1 local_3f8 [8];
  Surface referenceScreen;
  Surface screen;
  ConstPixelBufferAccess *refAccess;
  float clipDepth;
  Vec4 color;
  int level;
  Vec4 depthLevelColors [10];
  GLuint depthLoc;
  GLuint colorLoc;
  GLuint coordLoc;
  GLuint glProgram;
  Program program;
  char *fragmentShader;
  char *vertexShader;
  RGBA local_94;
  undefined1 local_90 [4];
  RGBA compareThreshold;
  Renderbuffer renderbufferDepth;
  undefined1 local_68 [8];
  Renderbuffer renderbufferColor;
  Framebuffer framebuffer;
  TestLog *log;
  Functions *gl;
  Texture2D *reference_local;
  MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img_local;
  GLES2ImageApi *api_local;
  RenderDepthbuffer *this_local;
  
  gl_00 = api->m_gl;
  this_00 = glu::CallLogWrapper::getLog(&api->super_CallLogWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &renderbufferColor.super_ObjectWrapper.m_object,gl_00);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_68,gl_00);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_90,gl_00);
  tcu::RGBA::RGBA(&local_94,0x20,0x20,0x20,0x20);
  pTVar14 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid);
  if ((pTVar14->order != DS) &&
     (pTVar14 = tcu::TextureLevelPyramid::getFormat(&reference->super_TextureLevelPyramid),
     pTVar14->order != D)) {
    this_01 = (IllegalRendererException *)__cxa_allocate_exception(8);
    *this_01 = (IllegalRendererException)0x0;
    IllegalRendererException::IllegalRendererException(this_01);
    __cxa_throw(this_01,&IllegalRendererException::typeinfo,
                IllegalRendererException::~IllegalRendererException);
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)&vertexShader,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertexShader,(char (*) [28])"Rendering with depth buffer")
  ;
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vertexShader);
  do {
    p_Var1 = gl_00->bindFramebuffer;
    dVar8 = glu::ObjectWrapper::operator*
                      ((ObjectWrapper *)&renderbufferColor.super_ObjectWrapper.m_object);
    (*p_Var1)(0x8d40,dVar8);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1d4);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  do {
    p_Var2 = gl_00->bindRenderbuffer;
    dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_68);
    (*p_Var2)(0x8d41,dVar8);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1d6);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  do {
    p_Var3 = gl_00->renderbufferStorage;
    iVar11 = tcu::Texture2D::getWidth(reference);
    iVar12 = tcu::Texture2D::getHeight(reference);
    (*p_Var3)(0x8d41,0x8056,iVar11,iVar12);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,
                    "renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1d7);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_68);
  framebufferRenderbuffer(gl_00,0x8ce0,dVar8);
  do {
    p_Var2 = gl_00->bindRenderbuffer;
    dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_90);
    (*p_Var2)(0x8d41,dVar8);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1da);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  egl = (api->super_ImageApi).m_egl;
  this_03 = de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::
            operator*(&img->
                       super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>);
  img_00 = eglu::UniqueImage::operator*(this_03);
  imageTargetRenderbuffer(egl,gl_00,img_00);
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_90);
  framebufferRenderbuffer(gl_00,0x8d00,dVar8);
  do {
    (*gl_00->bindRenderbuffer)(0x8d41,0);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1dd);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  do {
    p_Var4 = gl_00->viewport;
    iVar11 = tcu::Texture2D::getWidth(reference);
    iVar12 = tcu::Texture2D::getHeight(reference);
    (*p_Var4)(0,0,iVar11,iVar12);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x1df);
    dVar10 = ::deGetFalse();
  } while (dVar10 != 0);
  program.super_ShaderProgram.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_c52dc3;
  anon_unknown_1::Program::Program
            ((Program *)&coordLoc,gl_00,
             "attribute highp vec2 a_coord;\nuniform highp float u_depth;\nvoid main(void) {\n\tgl_Position = vec4(a_coord, u_depth, 1.0);\n}\n"
             ,"uniform mediump vec4 u_color;\nvoid main(void) {\n\tgl_FragColor = u_color;\n}");
  while ((dVar10 = ::deGetFalse(), dVar10 == 0 &&
         (bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)&coordLoc), bVar7))) {
    dVar10 = ::deGetFalse();
    if (dVar10 == 0) {
      dVar8 = glu::ShaderProgram::getProgram((ShaderProgram *)&coordLoc);
      do {
        (*gl_00->useProgram)(dVar8);
        GVar9 = (*gl_00->getError)();
        glu::checkError(GVar9,"useProgram(glProgram)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                        ,499);
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      GVar13 = (*gl_00->getAttribLocation)(dVar8,"a_coord");
      while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (GVar13 != 0xffffffff))) {
        dVar10 = ::deGetFalse();
        if (dVar10 == 0) {
          depthLevelColors[9].m_data[3] = (float)(*gl_00->getUniformLocation)(dVar8,"u_color");
          while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (depthLevelColors[9].m_data[3] != -NAN)))
          {
            dVar10 = ::deGetFalse();
            if (dVar10 == 0) {
              depthLevelColors[9].m_data[2] = (float)(*gl_00->getUniformLocation)(dVar8,"u_depth");
              while ((dVar10 = ::deGetFalse(), dVar10 == 0 &&
                     (depthLevelColors[9].m_data[2] != -NAN))) {
                dVar10 = ::deGetFalse();
                if (dVar10 == 0) {
                  do {
                    (*gl_00->clearColor)(0.5,1.0,0.5,1.0);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"clearColor(0.5f, 1.0f, 0.5f, 1.0f)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1fe);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->clear)(0x4000);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"clear(GL_COLOR_BUFFER_BIT)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x1ff);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(color.m_data + 3),1.0,0.0,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[0].m_data + 2),0.0,1.0,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[1].m_data + 2),1.0,1.0,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[2].m_data + 2),0.0,0.0,1.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[3].m_data + 2),1.0,0.0,1.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[4].m_data + 2),1.0,1.0,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[5].m_data + 2),1.0,1.0,1.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[6].m_data + 2),0.5,0.0,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[7].m_data + 2),0.0,0.5,0.0,1.0);
                  tcu::Vector<float,_4>::Vector
                            ((Vector<float,_4> *)(depthLevelColors[8].m_data + 2),0.5,0.5,0.0,1.0);
                  do {
                    (*gl_00->enableVertexAttribArray)(GVar13);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"enableVertexAttribArray(coordLoc)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x20f);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->vertexAttribPointer)(GVar13,2,0x1406,'\0',0,squareTriangleCoords);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,
                                    "vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x210);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->enable)(0xb71);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"enable(GL_DEPTH_TEST)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x212);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->depthFunc)(0x201);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"depthFunc(GL_LESS)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x213);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->depthMask)('\0');
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"depthMask(GL_FALSE)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x214);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  for (color.m_data[2] = 0.0; (int)color.m_data[2] < 10;
                      color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
                    tcu::Vector<float,_4>::Vector
                              ((Vector<float,_4> *)((long)&refAccess + 4),
                               (Vector<float,_4> *)((&color)[(int)color.m_data[2]].m_data + 3));
                    fVar17 = (float)((int)color.m_data[2] + 1) * 0.1;
                    refAccess._0_4_ = fVar17 + fVar17 + -1.0;
                    do {
                      fVar17 = depthLevelColors[9].m_data[3];
                      p_Var5 = gl_00->uniform4f;
                      fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)((long)&refAccess + 4));
                      fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)((long)&refAccess + 4));
                      fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)((long)&refAccess + 4));
                      fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)((long)&refAccess + 4));
                      (*p_Var5)((GLint)fVar17,fVar18,fVar19,fVar20,fVar21);
                      GVar9 = (*gl_00->getError)();
                      glu::checkError(GVar9,
                                      "uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w())"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                      ,0x21b);
                      dVar10 = ::deGetFalse();
                    } while (dVar10 != 0);
                    do {
                      (*gl_00->uniform1f)((GLint)depthLevelColors[9].m_data[2],refAccess._0_4_);
                      GVar9 = (*gl_00->getError)();
                      glu::checkError(GVar9,"uniform1f(depthLoc, clipDepth)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                      ,0x21c);
                      dVar10 = ::deGetFalse();
                    } while (dVar10 != 0);
                    do {
                      (*gl_00->drawArrays)(4,0,6);
                      GVar9 = (*gl_00->getError)();
                      glu::checkError(GVar9,"drawArrays(GL_TRIANGLES, 0, 6)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                      ,0x21d);
                      dVar10 = ::deGetFalse();
                    } while (dVar10 != 0);
                  }
                  do {
                    (*gl_00->depthMask)('\x01');
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"depthMask(GL_TRUE)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x220);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->disable)(0xb71);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"disable(GL_DEPTH_TEST)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x221);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->disableVertexAttribArray)(GVar13);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"disableVertexAttribArray(coordLoc)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x222);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  this_04 = &tcu::TextureLevelPyramid::getLevel
                                       (&reference->super_TextureLevelPyramid,0)->
                             super_ConstPixelBufferAccess;
                  iVar11 = tcu::Texture2D::getWidth(reference);
                  iVar12 = tcu::Texture2D::getHeight(reference);
                  tcu::Surface::Surface((Surface *)&referenceScreen.m_pixels.m_cap,iVar11,iVar12);
                  iVar11 = tcu::Texture2D::getWidth(reference);
                  iVar12 = tcu::Texture2D::getHeight(reference);
                  tcu::Surface::Surface((Surface *)local_3f8,iVar11,iVar12);
                  p_Var6 = gl_00->readPixels;
                  iVar11 = tcu::Surface::getWidth((Surface *)&referenceScreen.m_pixels.m_cap);
                  iVar12 = tcu::Surface::getHeight((Surface *)&referenceScreen.m_pixels.m_cap);
                  tcu::Surface::getAccess
                            ((PixelBufferAccess *)&x,(Surface *)&referenceScreen.m_pixels.m_cap);
                  pvVar16 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&x);
                  (*p_Var6)(0,0,iVar11,iVar12,0x1908,0x1401,pvVar16);
                  for (result.m_data[3] = 0.0; fVar17 = result.m_data[3],
                      iVar11 = tcu::Texture2D::getHeight(reference), (int)fVar17 < iVar11;
                      result.m_data[3] = (float)((int)result.m_data[3] + 1)) {
                    for (result.m_data[2] = 0.0; fVar17 = result.m_data[2],
                        iVar11 = tcu::Texture2D::getWidth(reference), (int)fVar17 < iVar11;
                        result.m_data[2] = (float)((int)result.m_data[2] + 1)) {
                      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_438,0.5,1.0,0.5,1.0)
                      ;
                      for (local_43c = 0; local_43c < 10; local_43c = local_43c + 1) {
                        iVar11 = local_43c + 1;
                        fVar17 = tcu::ConstPixelBufferAccess::getPixDepth
                                           (this_04,(int)result.m_data[2],(int)result.m_data[3],0);
                        if ((float)iVar11 * 0.1 < fVar17) {
                          _auStack_438 = *(undefined8 *)((&color)[local_43c].m_data + 3);
                          result.m_data._0_8_ = *(undefined8 *)depthLevelColors[local_43c].m_data;
                        }
                      }
                      tcu::Surface::getAccess(&local_468,(Surface *)local_3f8);
                      tcu::PixelBufferAccess::setPixel
                                (&local_468,(Vec4 *)auStack_438,(int)result.m_data[2],
                                 (int)result.m_data[3],0);
                    }
                  }
                  do {
                    (*gl_00->bindFramebuffer)(0x8d40,0);
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x23a);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  do {
                    (*gl_00->finish)();
                    GVar9 = (*gl_00->getError)();
                    glu::checkError(GVar9,"finish()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                                    ,0x23b);
                    dVar10 = ::deGetFalse();
                  } while (dVar10 != 0);
                  bVar7 = tcu::pixelThresholdCompare
                                    (this_00,"Depth buffer rendering result",
                                     "Result from rendering with depth buffer",(Surface *)local_3f8,
                                     (Surface *)&referenceScreen.m_pixels.m_cap,&local_94,
                                     COMPARE_LOG_RESULT);
                  tcu::Surface::~Surface((Surface *)local_3f8);
                  tcu::Surface::~Surface((Surface *)&referenceScreen.m_pixels.m_cap);
                  anon_unknown_1::Program::~Program((Program *)&coordLoc);
                  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_90);
                  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
                            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_68);
                  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                            ((TypedObjectWrapper<(glu::ObjectType)3> *)
                             &renderbufferColor.super_ObjectWrapper.m_object);
                  return bVar7;
                }
              }
              pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar15,"Couldn\'t find uniform u_depth","(int)depthLoc != (int)-1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                         ,0x1fc);
              __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar15,"Couldn\'t find uniform u_color","(int)colorLoc != (int)-1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                     ,0x1f9);
          __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar15,"Couldn\'t find attribute a_coord","(int)coordLoc != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                 ,0x1f6);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar15,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
             ,0x1f0);
  __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool GLES2ImageApi::RenderDepthbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl					= api.m_gl;
	tcu::TestLog&			log					= api.getLog();
	Framebuffer				framebuffer			(gl);
	Renderbuffer			renderbufferColor	(gl);
	Renderbuffer			renderbufferDepth	(gl);
	const tcu::RGBA			compareThreshold	(32, 32, 32, 32); // layer colors are far apart, large thresholds are ok

	// Branch only taken in TryAll case
	if (reference.getFormat().order != tcu::TextureFormat::DS && reference.getFormat().order != tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, interpreting non-depth data as depth data is not meaningful

	log << tcu::TestLog::Message << "Rendering with depth buffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferColor));
	GLU_CHECK_GLW_CALL(gl, renderbufferStorage(GL_RENDERBUFFER, GL_RGBA4, reference.getWidth(), reference.getHeight()));
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbufferColor);

	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbufferDepth));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_DEPTH_ATTACHMENT, *renderbufferDepth);
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	// Render
	const char* vertexShader =
		"attribute highp vec2 a_coord;\n"
		"uniform highp float u_depth;\n"
		"void main(void) {\n"
		"\tgl_Position = vec4(a_coord, u_depth, 1.0);\n"
		"}\n";

	const char* fragmentShader =
		"uniform mediump vec4 u_color;\n"
		"void main(void) {\n"
		"\tgl_FragColor = u_color;\n"
		"}";

	Program program(gl, vertexShader, fragmentShader);
	TCU_CHECK(program.isOk());

	GLuint glProgram = program.getProgram();
	GLU_CHECK_GLW_CALL(gl, useProgram(glProgram));

	GLuint coordLoc = gl.getAttribLocation(glProgram, "a_coord");
	TCU_CHECK_MSG((int)coordLoc != -1, "Couldn't find attribute a_coord");

	GLuint colorLoc = gl.getUniformLocation(glProgram, "u_color");
	TCU_CHECK_MSG((int)colorLoc != (int)-1, "Couldn't find uniform u_color");

	GLuint depthLoc = gl.getUniformLocation(glProgram, "u_depth");
	TCU_CHECK_MSG((int)depthLoc != (int)-1, "Couldn't find uniform u_depth");

	GLU_CHECK_GLW_CALL(gl, clearColor(0.5f, 1.0f, 0.5f, 1.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

	tcu::Vec4 depthLevelColors[] = {
		tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f),

		tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f),
		tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f)
	};

	GLU_CHECK_GLW_CALL(gl, enableVertexAttribArray(coordLoc));
	GLU_CHECK_GLW_CALL(gl, vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, squareTriangleCoords));

	GLU_CHECK_GLW_CALL(gl, enable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, depthFunc(GL_LESS));
	GLU_CHECK_GLW_CALL(gl, depthMask(GL_FALSE));

	for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
	{
		const tcu::Vec4	color		= depthLevelColors[level];
		const float		clipDepth	= ((float)(level + 1) * 0.1f) * 2.0f - 1.0f; // depth in clip coords

		GLU_CHECK_GLW_CALL(gl, uniform4f(colorLoc, color.x(), color.y(), color.z(), color.w()));
		GLU_CHECK_GLW_CALL(gl, uniform1f(depthLoc, clipDepth));
		GLU_CHECK_GLW_CALL(gl, drawArrays(GL_TRIANGLES, 0, 6));
	}

	GLU_CHECK_GLW_CALL(gl, depthMask(GL_TRUE));
	GLU_CHECK_GLW_CALL(gl, disable(GL_DEPTH_TEST));
	GLU_CHECK_GLW_CALL(gl, disableVertexAttribArray(coordLoc));

	const ConstPixelBufferAccess&	refAccess		= reference.getLevel(0);
	tcu::Surface					screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface					referenceScreen	(reference.getWidth(), reference.getHeight());

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	for (int y = 0; y < reference.getHeight(); y++)
	{
		for (int x = 0; x < reference.getWidth(); x++)
		{
			tcu::Vec4 result = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);

			for (int level = 0; level < DE_LENGTH_OF_ARRAY(depthLevelColors); level++)
			{
				if ((float)(level + 1) * 0.1f < refAccess.getPixDepth(x, y))
					result = depthLevelColors[level];
			}

			referenceScreen.getAccess().setPixel(result, x, y);
		}
	}

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	return tcu::pixelThresholdCompare(log, "Depth buffer rendering result", "Result from rendering with depth buffer", referenceScreen, screen, compareThreshold, tcu::COMPARE_LOG_RESULT);
}